

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O0

void __thiscall bdQueryManager::clearQuery(bdQueryManager *this,bdNodeId *rmId)

{
  bdQuery *pbVar1;
  bool bVar2;
  int iVar3;
  reference ppbVar4;
  const_iterator local_48;
  _List_node_base *local_40;
  bdQuery *local_38;
  bdQuery *query;
  _List_node_base *local_28;
  _List_iterator<bdQuery_*> local_20;
  iterator it;
  bdNodeId *rmId_local;
  bdQueryManager *this_local;
  
  it._M_node = (_List_node_base *)rmId;
  std::_List_iterator<bdQuery_*>::_List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::begin(&this->mLocalQueries);
  local_20._M_node = local_28;
  while( true ) {
    query = (bdQuery *)
            std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::end(&this->mLocalQueries);
    bVar2 = std::operator!=(&local_20,(_Self *)&query);
    if (!bVar2) break;
    ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_20);
    iVar3 = ::operator==(&(*ppbVar4)->mId,(bdNodeId *)it._M_node);
    if (iVar3 == 0) {
      std::_List_iterator<bdQuery_*>::operator++(&local_20,0);
    }
    else {
      ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_20);
      local_38 = *ppbVar4;
      std::_List_const_iterator<bdQuery_*>::_List_const_iterator(&local_48,&local_20);
      local_40 = (_List_node_base *)
                 std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::erase
                           (&this->mLocalQueries,local_48);
      pbVar1 = local_38;
      local_20._M_node = local_40;
      if (local_38 != (bdQuery *)0x0) {
        bdQuery::~bdQuery(local_38);
        operator_delete(pbVar1,0xf8);
      }
    }
  }
  return;
}

Assistant:

void bdQueryManager::clearQuery(const bdNodeId *rmId) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end();) {
		if ((*it)->mId == *rmId) {
			bdQuery *query = (*it);
			it = mLocalQueries.erase(it);
			delete query;
		} else
			it++;
	}
}